

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O0

void bench_sign_run(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  undefined8 *in_RDI;
  secp256k1_ecdsa_signature signature;
  int j;
  size_t siglen;
  uchar sig [74];
  bench_data *data;
  int i;
  undefined1 local_b4 [64];
  int local_74;
  undefined8 local_70;
  undefined1 local_68 [32];
  undefined1 auStack_48 [48];
  undefined8 *local_18;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_18 = in_RDI;
  local_c = in_ESI;
  while( true ) {
    if (local_c <= local_10) {
      return;
    }
    local_70 = 0x4a;
    iVar1 = secp256k1_ecdsa_sign(*local_18,local_b4,local_18 + 1,local_18 + 5,0);
    if (iVar1 == 0) break;
    iVar1 = secp256k1_ecdsa_signature_serialize_der(*local_18,local_68,&local_70,local_b4);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c"
              ,0x7d,
              "test condition failed: secp256k1_ecdsa_signature_serialize_der(data->ctx, sig, &siglen, &signature)"
             );
      abort();
    }
    for (local_74 = 0; local_74 < 0x20; local_74 = local_74 + 1) {
      *(undefined1 *)((long)local_18 + (long)local_74 + 8) = local_68[local_74];
      *(undefined1 *)((long)local_18 + (long)local_74 + 0x28) = local_68[local_74 + 0x20];
    }
    local_10 = local_10 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c",
          0x7c,
          "test condition failed: secp256k1_ecdsa_sign(data->ctx, &signature, data->msg, data->key, NULL, NULL)"
         );
  abort();
}

Assistant:

static void bench_sign_run(void* arg, int iters) {
    int i;
    bench_data *data = (bench_data*)arg;

    unsigned char sig[74];
    for (i = 0; i < iters; i++) {
        size_t siglen = 74;
        int j;
        secp256k1_ecdsa_signature signature;
        CHECK(secp256k1_ecdsa_sign(data->ctx, &signature, data->msg, data->key, NULL, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(data->ctx, sig, &siglen, &signature));
        for (j = 0; j < 32; j++) {
            data->msg[j] = sig[j];
            data->key[j] = sig[j + 32];
        }
    }
}